

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O2

JSONNode ** json_realloc<JSONNode*>(JSONNode **ptr,size_t count)

{
  JSONNode **ppJVar1;
  allocator local_31;
  json_string local_30;
  
  ppJVar1 = (JSONNode **)realloc(ptr,count << 3);
  std::__cxx11::string::string((string *)&local_30,"Out of memory",&local_31);
  JSONDebug::_JSON_ASSERT(ppJVar1 != (JSONNode **)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return ppJVar1;
}

Assistant:

static inline T * json_realloc(T * ptr, size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, check the results of realloc to be sure it was successful
		  void * result = std::realloc(ptr, count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  return (T *)result;
	   #else
		  return (T *)std::realloc(ptr, count * sizeof(T));
	   #endif
    }